

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

int main(int argc,char **argv)

{
  Benchmark *b;
  char *__s;
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar5;
  int siz;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  StringPiece local_120;
  RE2 local_110;
  size_t sVar4;
  
  if (0 < nbenchmarks) {
    lVar7 = 0;
    do {
      b = benchmarks[lVar7];
      if (argc == 1) {
LAB_0012b213:
        iVar2 = b->threadlo;
        if (b->threadlo <= b->threadhi) {
          do {
            siz = b->lo;
            iVar3 = b->hi;
            if (iVar3 < 2) {
              iVar3 = 1;
            }
            if (siz <= iVar3) {
              if (siz < 2) {
                siz = 1;
              }
              do {
                RunBench(b,iVar2,siz);
                siz = siz * 2;
                iVar3 = b->hi;
                if (iVar3 < 2) {
                  iVar3 = 1;
                }
              } while (siz <= iVar3);
            }
            bVar8 = iVar2 < b->threadhi;
            iVar2 = iVar2 + 1;
          } while (bVar8);
        }
      }
      else {
        bVar8 = 1 < argc;
        if (1 < argc) {
          __s = b->name;
          bVar8 = true;
          uVar6 = 2;
          do {
            if (__s == (char *)0x0) {
              iVar2 = 0;
            }
            else {
              sVar4 = strlen(__s);
              iVar2 = (int)sVar4;
            }
            re2::RE2::RE2(&local_110,argv[uVar6 - 1]);
            local_120.ptr_ = __s;
            local_120.length_ = iVar2;
            bVar1 = re2::RE2::PartialMatchN(&local_120,&local_110,(Arg **)0x0,0);
            re2::RE2::~RE2(&local_110);
            if (bVar1) break;
            bVar8 = uVar6 < (uint)argc;
            lVar5 = (1 - (ulong)(uint)argc) + uVar6;
            uVar6 = uVar6 + 1;
          } while (lVar5 != 1);
        }
        if (bVar8) goto LAB_0012b213;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < nbenchmarks);
  }
  return 0;
}

Assistant:

int main(int argc, const char** argv) {
	for(int i = 0; i < nbenchmarks; i++) {
		Benchmark* b = benchmarks[i];
		if(match(b->name, argc, argv))
			for(int j = b->threadlo; j <= b->threadhi; j++)
				for(int k = max(b->lo, 1); k <= max(b->hi, 1); k<<=1)
					RunBench(b, j, k);
	}
}